

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Poly1305_64.c
# Opt level: O1

void Hacl_Poly1305_64_update_last
               (Hacl_Impl_Poly1305_64_State_poly1305_state st,uint8_t *m,uint32_t len1)

{
  size_t __n;
  uint32_t i;
  ulong __n_00;
  uint8_t block [16];
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  
  if (len1 != 0) {
    __n_00 = (ulong)len1;
    __n = 0;
    if (len1 < 0x10) {
      __n = 0x10 - __n_00;
    }
    memset((undefined1 *)((long)&local_58 + __n_00),0,__n);
    memcpy(&local_58,m,__n_00);
    *(undefined1 *)((long)&local_58 + __n_00) = 1;
    local_48 = local_58 & 0xfffffffffff;
    uStack_40 = (local_50 & 0xffffff) << 0x14 | local_58 >> 0x2c;
    local_38 = local_50 >> 0x18;
    Hacl_Bignum_AddAndMultiply_add_and_multiply(st.h,&local_48,st.r);
  }
  Hacl_Impl_Poly1305_64_poly1305_last_pass(st.h);
  return;
}

Assistant:

void
Hacl_Poly1305_64_update_last(
  Hacl_Impl_Poly1305_64_State_poly1305_state st,
  uint8_t *m,
  uint32_t len1
)
{
  if (!((uint64_t)len1 == (uint64_t)0U))
    Hacl_Impl_Poly1305_64_poly1305_process_last_block(st, m, (uint64_t)len1);
  Hacl_Impl_Poly1305_64_State_poly1305_state scrut = st;
  uint64_t *h = scrut.h;
  uint64_t *acc = h;
  Hacl_Impl_Poly1305_64_poly1305_last_pass(acc);
}